

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  Vdbe *p;
  long lVar1;
  int iVar2;
  char *pcVar3;
  i64 value;
  
  p = pParse->pVdbe;
  if ((pExpr->flags & 0x400) != 0) {
    iVar2 = -(pExpr->u).iValue;
    if (negFlag == 0) {
      iVar2 = (pExpr->u).iValue;
    }
    sqlite3VdbeAddOp2(p,7,iVar2,iMem);
    return;
  }
  pcVar3 = (pExpr->u).zToken;
  iVar2 = sqlite3Strlen30(pcVar3);
  iVar2 = sqlite3Atoi64(pcVar3,&value,iVar2,'\x01');
  if (iVar2 == 0) {
    if (negFlag == 0) goto LAB_0015bd31;
  }
  else if (negFlag == 0 || iVar2 != 2) {
    codeReal(p,pcVar3,negFlag,iMem);
    return;
  }
  lVar1 = -value;
  value = -0x8000000000000000;
  if (iVar2 != 2) {
    value = lVar1;
  }
LAB_0015bd31:
  pcVar3 = dup8bytes(p,(char *)&value);
  sqlite3VdbeAddOp4(p,8,0,iMem,0,pcVar3,-0xd);
  return;
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3Atoi64(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    if( c==0 || (c==2 && negFlag) ){
      char *zV;
      if( negFlag ){ value = c==2 ? SMALLEST_INT64 : -value; }
      zV = dup8bytes(v, (char*)&value);
      sqlite3VdbeAddOp4(v, OP_Int64, 0, iMem, 0, zV, P4_INT64);
    }else{
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%s", negFlag ? "-" : "", z);
#else
      codeReal(v, z, negFlag, iMem);
#endif
    }
  }
}